

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

unique_function_record __thiscall pybind11::cpp_function::make_function_record(cpp_function *this)

{
  function_record *this_00;
  cpp_function *this_local;
  
  this_00 = (function_record *)operator_new(0x88);
  detail::function_record::function_record(this_00);
  std::
  unique_ptr<pybind11::detail::function_record,pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::unique_ptr<pybind11::cpp_function::InitializingFunctionRecordDeleter,void>
            ((unique_ptr<pybind11::detail::function_record,pybind11::cpp_function::InitializingFunctionRecordDeleter>
              *)this,this_00);
  return (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
          )(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
            )this;
}

Assistant:

make_function_record() {
        return unique_function_record(new detail::function_record());
    }